

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib.c
# Opt level: O0

void WjTestLib_FreeTests(void)

{
  WjtlTestList *pWVar1;
  undefined8 *puVar2;
  undefined8 *local_28;
  WjtlTestList *test;
  WjtlTestList *nextTest;
  WjtlGroupList *group;
  WjtlGroupList *nextGroup;
  
  nextTest = (WjtlTestList *)gGroupListHead;
  while (nextTest != (WjtlTestList *)0x0) {
    pWVar1 = nextTest->Next;
    local_28 = (undefined8 *)nextTest->NumAllocations;
    while (local_28 != (undefined8 *)0x0) {
      puVar2 = (undefined8 *)*local_28;
      free((void *)local_28[1]);
      local_28[1] = 0;
      free(local_28);
      local_28 = puVar2;
    }
    nextTest->NumAllocations = 0;
    nextTest->NumDeallocations = 0;
    free(nextTest->TestName);
    nextTest->TestName = (char *)0x0;
    free(nextTest);
    nextTest = pWVar1;
  }
  gGroupListHead = (WjtlGroupList *)0x0;
  gGroupListTail = (WjtlGroupList *)0x0;
  return;
}

Assistant:

void
    WjTestLib_FreeTests
    (
        void
    )
{
    WjtlGroupList* nextGroup = NULL;
    for( WjtlGroupList* group=gGroupListHead; group!=NULL; group=nextGroup )
    {
        nextGroup = group->Next;

        WjtlTestList* nextTest = NULL;
        for( WjtlTestList* test=group->TestListHead; test!=NULL; test=nextTest )
        {
            nextTest = test->Next;

            free( test->TestName );
            test->TestName = NULL;
            free( test );
            test = NULL;
        }

        group->TestListHead = NULL;
        group->TestListTail = NULL;

        free( group->GroupName );
        group->GroupName = NULL;
        free( group );
        group = NULL;
    }

    gGroupListHead = NULL;
    gGroupListTail = NULL;
}